

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

xml_node<char> * __thiscall
rapidxml::xml_node<char>::first_node
          (xml_node<char> *this,char *name,size_t name_size,bool case_sensitive)

{
  bool bVar1;
  xml_node<char> *pxVar2;
  size_t size1;
  char *p1;
  
  if (name == (char *)0x0) {
    pxVar2 = this->m_first_node;
  }
  else {
    if (name_size == 0) {
      name_size = internal::measure<char>(name);
    }
    for (pxVar2 = this->m_first_node; pxVar2 != (xml_node<char> *)0x0;
        pxVar2 = next_sibling(pxVar2,(char *)0x0,0,true)) {
      p1 = (pxVar2->super_xml_base<char>).m_name;
      if (p1 == (char *)0x0) {
        p1 = &xml_base<char>::nullstr()::zero;
        size1 = 0;
      }
      else {
        size1 = (pxVar2->super_xml_base<char>).m_name_size;
      }
      bVar1 = internal::compare<char>(p1,size1,name,name_size,case_sensitive);
      if (bVar1) {
        return pxVar2;
      }
    }
    pxVar2 = (xml_node<char> *)0x0;
  }
  return pxVar2;
}

Assistant:

xml_node<Ch> *first_node(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_node<Ch> *child = m_first_node; child; child = child->next_sibling())
                    if (internal::compare(child->name(), child->name_size(), name, name_size, case_sensitive))
                        return child;
                return 0;
            }
            else
                return m_first_node;
        }